

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall duckdb::VacuumTask::ExecuteTask(VacuumTask *this)

{
  vector<duckdb::LogicalType,_true> *types;
  RowGroupCollection *collection_p;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var1;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> this_00;
  RowGroup *pRVar2;
  pointer pRVar3;
  Allocator *allocator;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  type this_01;
  pointer pCVar7;
  InternalException *this_02;
  size_type __n;
  CollectionCheckpointState *__n_00;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *append_count;
  CollectionCheckpointState *checkpoint_state;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  idx_t start;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *slice_count;
  vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
  new_row_groups;
  vector<unsigned_long,_true> append_counts;
  vector<duckdb::StorageIndex,_true> column_ids;
  DataChunk scan_chunk;
  TableScanState scan_state;
  TableAppendState append_state;
  vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  local_3d8;
  vector<unsigned_long,_true> local_3b8;
  ulong local_3a0;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_398;
  ulong local_380;
  undefined1 local_378 [32];
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_358;
  DataChunk local_340;
  TableScanState local_300;
  TableAppendState local_130;
  
  collection_p = ((this->super_BaseCheckpointTask).checkpoint_state)->collection;
  uVar11 = collection_p->row_group_size;
  types = &collection_p->types;
  local_3d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  if (this->target_count != 0) {
    iVar10 = this->merge_rows;
    start = this->row_start;
    uVar9 = 0;
    do {
      uVar8 = uVar11;
      if (iVar10 < uVar11) {
        uVar8 = iVar10;
      }
      pRVar2 = (RowGroup *)operator_new(200);
      RowGroup::RowGroup(pRVar2,collection_p,start,uVar8);
      local_300.table_state.row_group = pRVar2;
      pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                           *)&local_300);
      RowGroup::InitializeEmpty(pRVar3,types);
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>>
                ((vector<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>>>
                  *)&local_3d8,
                 (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 &local_300);
      local_130.row_group_append_state.parent = (TableAppendState *)0x0;
      if (local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,
                   (iterator)
                   local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&local_130);
      }
      else {
        *local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = 0;
        local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pRVar2 = local_300.table_state.row_group;
      if (local_300.table_state.row_group != (RowGroup *)0x0) {
        RowGroup::~RowGroup(local_300.table_state.row_group);
        operator_delete(pRVar2);
      }
      iVar10 = iVar10 - uVar8;
      start = start + uVar8;
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->target_count);
  }
  DataChunk::DataChunk(&local_340);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(&local_340,allocator,types,0x800);
  local_398.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_300.table_state.row_group = (RowGroup *)0x0;
  if ((collection_p->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (collection_p->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
      emplace_back<unsigned_long&>
                ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&local_398,
                 (unsigned_long *)&local_300);
      local_300.table_state.row_group =
           (RowGroup *)
           ((long)&((local_300.table_state.row_group)->super_SegmentBase<duckdb::RowGroup>).start +
           1);
    } while (local_300.table_state.row_group <
             (RowGroup *)
             (((long)(collection_p->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(collection_p->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  TableAppendState::TableAppendState(&local_130);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
                         *)&local_3d8,0);
  pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     (pvVar4);
  RowGroup::InitializeAppend(pRVar3,&local_130.row_group_append_state);
  TableScanState::TableScanState(&local_300);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
            (&local_358,&local_398);
  TableScanState::Initialize
            (&local_300,(vector<duckdb::StorageIndex,_true> *)&local_358,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_358);
  CollectionScanState::Initialize(&local_300.table_state,types);
  local_300.table_state.max_row = 0xffffffffffffffff;
  if (this->merge_count != 0) {
    uVar9 = this->segment_idx;
    local_380 = (long)(this->vacuum_state->row_group_counts).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->vacuum_state->row_group_counts).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
    if (uVar9 < local_380) {
      __n = 0;
      local_3a0 = 0;
      do {
        pvVar5 = vector<unsigned_long,_true>::operator[]
                           (&this->vacuum_state->row_group_counts,uVar9);
        if (*pvVar5 != 0) {
          pvVar6 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[]
                             (((this->super_BaseCheckpointTask).checkpoint_state)->segments,uVar9);
          this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                    operator*(&pvVar6->node);
          RowGroup::InitializeScan(this_01,&local_300.table_state);
          local_3a0 = local_3a0 + 1;
LAB_006385d8:
          DataChunk::Reset(&local_340);
          RowGroup::ScanCommitted
                    (this_01,&local_300.table_state,&local_340,TABLE_SCAN_LATEST_COMMITTED_ROWS);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_340.count !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            DataChunk::Flatten(&local_340);
            slice_count = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_340.count;
            while (slice_count != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pvVar5 = vector<unsigned_long,_true>::operator[](&local_3b8,__n);
              append_count = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar11 - *pvVar5);
              if (slice_count < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar11 - *pvVar5))
              {
                append_count = slice_count;
              }
              pvVar4 = vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
                       ::operator[]((vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
                                     *)&local_3d8,__n);
              pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                       operator->(pvVar4);
              RowGroup::Append(pRVar3,&local_130.row_group_append_state,&local_340,
                               (idx_t)append_count);
              pvVar5 = vector<unsigned_long,_true>::operator[](&local_3b8,__n);
              *pvVar5 = (long)&append_count->_vptr__Sp_counted_base + *pvVar5;
              pvVar5 = vector<unsigned_long,_true>::operator[](&local_3b8,__n);
              slice_count = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)slice_count - (long)append_count);
              uVar8 = __n + 1;
              if ((slice_count == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 ((*pvVar5 != uVar11 ||
                  ((ulong)((long)local_3d8.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3d8.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar8)))) break;
              pvVar4 = vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
                       ::operator[]((vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
                                     *)&local_3d8,uVar8);
              pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                       operator->(pvVar4);
              RowGroup::InitializeAppend(pRVar3,&local_130.row_group_append_state);
              DataChunk::Slice(&local_340,(idx_t)append_count,(idx_t)slice_count);
              __n = uVar8;
            }
            goto LAB_006385d8;
          }
          RowGroup::CommitDrop(this_01);
          pvVar6 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[]
                             (((this->super_BaseCheckpointTask).checkpoint_state)->segments,uVar9);
          _Var1._M_head_impl =
               (pvVar6->node).
               super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
               super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
               super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
          (pvVar6->node).super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
          _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
          super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
          if (_Var1._M_head_impl != (RowGroup *)0x0) {
            RowGroup::~RowGroup(_Var1._M_head_impl);
            operator_delete(_Var1._M_head_impl);
          }
        }
      } while ((local_3a0 < this->merge_count) && (uVar9 = uVar9 + 1, uVar9 < local_380));
    }
  }
  if (this->target_count == 0) {
    if (this->merge_rows != 0) goto LAB_006388a2;
  }
  else {
    __n_00 = (CollectionCheckpointState *)0x0;
    iVar10 = 0;
    do {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
                             *)&local_3d8,(size_type)__n_00);
      unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->(pvVar4);
      pvVar6 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[]
                         (((this->super_BaseCheckpointTask).checkpoint_state)->segments,
                          (long)&__n_00->collection + this->segment_idx);
      _Var1._M_head_impl =
           (pvVar4->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t
           .super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
           super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
      (pvVar4->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
      super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
      super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
      this_00._M_head_impl =
           (pvVar6->node).super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
           ._M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
           super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
      (pvVar6->node).super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t
      .super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
      super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = _Var1._M_head_impl;
      if (this_00._M_head_impl != (RowGroup *)0x0) {
        RowGroup::~RowGroup(this_00._M_head_impl);
        operator_delete(this_00._M_head_impl);
      }
      checkpoint_state = __n_00;
      pvVar5 = vector<unsigned_long,_true>::operator[](&local_3b8,(size_type)__n_00);
      iVar10 = iVar10 + *pvVar5;
      __n_00 = (CollectionCheckpointState *)((long)&__n_00->collection + 1);
    } while (__n_00 < (CollectionCheckpointState *)this->target_count);
    if (iVar10 != this->merge_rows) {
LAB_006388a2:
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_378._0_8_ = local_378 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_378,
                 "Mismatch in row group count vs verify count in RowGroupCollection::Checkpoint","")
      ;
      InternalException::InternalException(this_02,(string *)local_378);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((CollectionCheckpointState *)this->target_count != (CollectionCheckpointState *)0x0) {
      uVar11 = 0;
      do {
        RowGroupCollection::GetCheckpointTask
                  ((RowGroupCollection *)local_378,checkpoint_state,
                   (idx_t)(this->super_BaseCheckpointTask).checkpoint_state);
        pCVar7 = unique_ptr<duckdb::CheckpointTask,_std::default_delete<duckdb::CheckpointTask>,_true>
                 ::operator->((unique_ptr<duckdb::CheckpointTask,_std::default_delete<duckdb::CheckpointTask>,_true>
                               *)local_378);
        (*(pCVar7->super_BaseCheckpointTask).super_BaseExecutorTask.super_Task._vptr_Task[6])
                  (pCVar7);
        if ((BlockManager *)local_378._0_8_ != (BlockManager *)0x0) {
          (**(code **)(*(long *)local_378._0_8_ + 8))();
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < this->target_count);
    }
  }
  TableScanState::~TableScanState(&local_300);
  TableAppendState::~TableAppendState(&local_130);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_398);
  DataChunk::~DataChunk(&local_340);
  if (local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  ::~vector(&local_3d8);
  return;
}

Assistant:

void ExecuteTask() override {
		auto &collection = checkpoint_state.collection;
		const idx_t row_group_size = collection.GetRowGroupSize();
		auto &types = collection.GetTypes();
		// create the new set of target row groups (initially empty)
		vector<unique_ptr<RowGroup>> new_row_groups;
		vector<idx_t> append_counts;
		idx_t row_group_rows = merge_rows;
		idx_t start = row_start;
		for (idx_t target_idx = 0; target_idx < target_count; target_idx++) {
			idx_t current_row_group_rows = MinValue<idx_t>(row_group_rows, row_group_size);
			auto new_row_group = make_uniq<RowGroup>(collection, start, current_row_group_rows);
			new_row_group->InitializeEmpty(types);
			new_row_groups.push_back(std::move(new_row_group));
			append_counts.push_back(0);

			row_group_rows -= current_row_group_rows;
			start += current_row_group_rows;
		}

		DataChunk scan_chunk;
		scan_chunk.Initialize(Allocator::DefaultAllocator(), types);

		vector<StorageIndex> column_ids;
		for (idx_t c = 0; c < types.size(); c++) {
			column_ids.emplace_back(c);
		}

		idx_t current_append_idx = 0;

		// fill the new row group with the merged rows
		TableAppendState append_state;
		new_row_groups[current_append_idx]->InitializeAppend(append_state.row_group_append_state);

		TableScanState scan_state;
		scan_state.Initialize(column_ids);
		scan_state.table_state.Initialize(types);
		scan_state.table_state.max_row = idx_t(-1);
		idx_t merged_groups = 0;
		idx_t total_row_groups = vacuum_state.row_group_counts.size();
		for (idx_t c_idx = segment_idx; merged_groups < merge_count && c_idx < total_row_groups; c_idx++) {
			if (vacuum_state.row_group_counts[c_idx] == 0) {
				continue;
			}
			merged_groups++;

			auto &current_row_group = *checkpoint_state.segments[c_idx].node;

			current_row_group.InitializeScan(scan_state.table_state);
			while (true) {
				scan_chunk.Reset();

				current_row_group.ScanCommitted(scan_state.table_state, scan_chunk,
				                                TableScanType::TABLE_SCAN_LATEST_COMMITTED_ROWS);
				if (scan_chunk.size() == 0) {
					break;
				}
				scan_chunk.Flatten();
				idx_t remaining = scan_chunk.size();
				while (remaining > 0) {
					idx_t append_count = MinValue<idx_t>(remaining, row_group_size - append_counts[current_append_idx]);
					new_row_groups[current_append_idx]->Append(append_state.row_group_append_state, scan_chunk,
					                                           append_count);
					append_counts[current_append_idx] += append_count;
					remaining -= append_count;
					const bool row_group_full = append_counts[current_append_idx] == row_group_size;
					const bool last_row_group = current_append_idx + 1 >= new_row_groups.size();
					if (remaining > 0 || (row_group_full && !last_row_group)) {
						// move to the next row group
						current_append_idx++;
						new_row_groups[current_append_idx]->InitializeAppend(append_state.row_group_append_state);
						// slice chunk for the next append
						scan_chunk.Slice(append_count, remaining);
					}
				}
			}
			// drop the row group after merging
			current_row_group.CommitDrop();
			checkpoint_state.segments[c_idx].node.reset();
		}
		idx_t total_append_count = 0;
		for (idx_t target_idx = 0; target_idx < target_count; target_idx++) {
			auto &row_group = new_row_groups[target_idx];
			row_group->Verify();

			// assign the new row group to the current segment
			checkpoint_state.segments[segment_idx + target_idx].node = std::move(row_group);
			total_append_count += append_counts[target_idx];
		}
		if (total_append_count != merge_rows) {
			throw InternalException("Mismatch in row group count vs verify count in RowGroupCollection::Checkpoint");
		}
		// merging is complete - execute checkpoint tasks of the target row groups
		for (idx_t i = 0; i < target_count; i++) {
			auto checkpoint_task = collection.GetCheckpointTask(checkpoint_state, segment_idx + i);
			checkpoint_task->ExecuteTask();
		}
	}